

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O0

void __thiscall icu_63::number::impl::SymbolsWrapper::doCleanup(SymbolsWrapper *this)

{
  SymbolsPointerType SVar1;
  SymbolsWrapper *this_local;
  
  SVar1 = this->fType;
  if (SVar1 != SYMPTR_NONE) {
    if (SVar1 == SYMPTR_DFS) {
      if ((this->fPtr).dfs != (DecimalFormatSymbols *)0x0) {
        (*(((this->fPtr).dfs)->super_UObject)._vptr_UObject[1])();
      }
    }
    else if ((SVar1 == SYMPTR_NS) && ((this->fPtr).dfs != (DecimalFormatSymbols *)0x0)) {
      (*(((this->fPtr).dfs)->super_UObject)._vptr_UObject[1])();
    }
  }
  return;
}

Assistant:

void SymbolsWrapper::doCleanup() {
    switch (fType) {
        case SYMPTR_NONE:
            // No action necessary
            break;
        case SYMPTR_DFS:
            delete fPtr.dfs;
            break;
        case SYMPTR_NS:
            delete fPtr.ns;
            break;
    }
}